

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall FIX::SocketInitiator::onWrite(SocketInitiator *this)

{
  socket_handle in_EDX;
  SocketConnector *in_RSI;
  
  onWrite((SocketInitiator *)&this[-1].m_settings.m_defaults,in_RSI,in_EDX);
  return;
}

Assistant:

void SocketInitiator::onWrite(SocketConnector &connector, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;
  if (pSocketConnection->processQueue()) {
    pSocketConnection->unsignal();
  }
}